

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
genRandom(vector<double,_std::allocator<double>_> *__return_storage_ptr__,int num_samples,
         int num_dimensions)

{
  result_type_conflict *prVar1;
  result_type_conflict rVar2;
  vector<double,_std::allocator<double>_> *__range1;
  double *v;
  result_type_conflict *prVar3;
  uniform_real_distribution<double> local_38;
  
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)num_dimensions * (long)num_samples,
             (allocator_type *)&local_38);
  local_38._M_param._M_a = -1.0;
  local_38._M_param._M_b = 1.0;
  prVar1 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (prVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_start; prVar3 != prVar1; prVar3 = prVar3 + 1) {
    rVar2 = std::uniform_real_distribution<double>::operator()(&local_38,&park_miller);
    *prVar3 = rVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> genRandom(int num_samples, int num_dimensions = 1){
    std::vector<double> x(Utils::size_mult(num_samples, num_dimensions));
    std::uniform_real_distribution<double> unif(-1.0, 1.0);
    for(auto &v : x) v = unif(park_miller);
    return x;
}